

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

void sub_avg_block_avx2(uint8_t *src,int32_t src_stride,uint8_t avg,int32_t width,int32_t height,
                       int16_t *dst,int32_t dst_stride,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [32];
  undefined7 in_register_00000011;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [32];
  
  auVar5._0_2_ = (undefined2)CONCAT71(in_register_00000011,avg);
  auVar5._2_2_ = auVar5._0_2_;
  auVar5._4_2_ = auVar5._0_2_;
  auVar5._6_2_ = auVar5._0_2_;
  auVar5._8_2_ = auVar5._0_2_;
  auVar5._10_2_ = auVar5._0_2_;
  auVar5._12_2_ = auVar5._0_2_;
  auVar5._14_2_ = auVar5._0_2_;
  auVar5._16_2_ = auVar5._0_2_;
  auVar5._18_2_ = auVar5._0_2_;
  auVar5._20_2_ = auVar5._0_2_;
  auVar5._22_2_ = auVar5._0_2_;
  auVar5._24_2_ = auVar5._0_2_;
  auVar5._26_2_ = auVar5._0_2_;
  auVar5._28_2_ = auVar5._0_2_;
  auVar5._30_2_ = auVar5._0_2_;
  iVar3 = 0;
  do {
    iVar2 = height - iVar3;
    if (3 < height - iVar3) {
      iVar2 = (uint)(use_downsampled_wiener_stats != 0) * 3 + 1;
    }
    for (lVar4 = 0; lVar4 < width; lVar4 = lVar4 + 0x10) {
      auVar1 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src + lVar4));
      auVar1 = vpsubw_avx2(auVar1,auVar5);
      *(undefined1 (*) [32])(dst + lVar4) = auVar1;
    }
    if (use_downsampled_wiener_stats == 0) {
      iVar2 = 1;
    }
    src = src + iVar2 * src_stride;
    dst = dst + iVar2 * dst_stride;
    iVar3 = iVar3 + iVar2;
  } while (iVar3 < height);
  return;
}

Assistant:

static inline void sub_avg_block_avx2(const uint8_t *src, int32_t src_stride,
                                      uint8_t avg, int32_t width,
                                      int32_t height, int16_t *dst,
                                      int32_t dst_stride,
                                      int use_downsampled_wiener_stats) {
  const __m256i avg_reg = _mm256_set1_epi16(avg);

  int32_t proc_ht = 0;
  do {
    int ds_factor =
        use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
    if (use_downsampled_wiener_stats &&
        (height - proc_ht < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
      ds_factor = height - proc_ht;
    }

    int32_t proc_wd = 0;
    while (proc_wd < width) {
      const __m128i s = _mm_loadu_si128((__m128i *)(src + proc_wd));
      const __m256i ss = _mm256_cvtepu8_epi16(s);
      const __m256i d = _mm256_sub_epi16(ss, avg_reg);
      _mm256_storeu_si256((__m256i *)(dst + proc_wd), d);
      proc_wd += 16;
    }

    src += ds_factor * src_stride;
    dst += ds_factor * dst_stride;
    proc_ht += ds_factor;
  } while (proc_ht < height);
}